

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_color.c
# Opt level: O3

void prf_obsolete_vertex_with_color_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  ulong uVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  double dVar4;
  
  puVar2 = (ulong *)node->data;
  uVar1 = *puVar2;
  auVar3._0_8_ = uVar1 & 0xffffffff;
  auVar3._8_4_ = (int)(uVar1 >> 0x20);
  auVar3._12_4_ = 0;
  dVar4 = DAT_0010f600._8_8_;
  auVar3 = auVar3 | _DAT_0010f600;
  vertex->x = (float64_t)(auVar3._0_8_ - (double)DAT_0010f600);
  vertex->y = (float64_t)(auVar3._8_8_ - dVar4);
  vertex->z = (float64_t)(double)(uint)puVar2[1];
  return;
}

Assistant:

void
prf_obsolete_vertex_with_color_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    bool_t complete = FALSE;
    int pos = 4;

    assert( node != NULL && vertex != NULL );
    do {
        node_data * data = (node_data *) node->data;
        vertex->x = (float64_t) data->x; pos += 4;
        vertex->y = (float64_t) data->y; pos += 4;
        vertex->z = (float64_t) data->z; pos += 4;
        complete = TRUE;
    } while ( FALSE );
#if 0 /* FIXME: 990504 larsa (need docs) */
    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with color", pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 2, "vertex with color is larger than %d bytes (%d)",
            pos, node->length );
#endif /* 0 - need doc */
}